

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_shader_precision_format
               (NegativeTestContext *ctx)

{
  NegativeTestContext *this;
  TestLog *this_00;
  MessageBuilder *pMVar1;
  allocator<char> local_1d9;
  string local_1d8;
  char *local_1b8 [3];
  MessageBuilder local_1a0;
  GLint local_20;
  GLint local_1c;
  GLint precision [1];
  GLint range [2];
  GLboolean shaderCompilerSupported;
  NegativeTestContext *ctx_local;
  
  unique0x1000023e = ctx;
  glu::CallLogWrapper::glGetBooleanv
            (&ctx->super_CallLogWrapper,0x8dfa,(GLboolean *)((long)range + 3));
  this_00 = glu::CallLogWrapper::getLog(&stack0xfffffffffffffff0->super_CallLogWrapper);
  tcu::TestLog::operator<<(&local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [25])"// GL_SHADER_COMPILER = ");
  local_1b8[0] = "GL_FALSE";
  if (range[0]._3_1_ != '\0') {
    local_1b8[0] = "GL_TRUE";
  }
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1b8);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  deMemset(&local_1c,0xcd,8);
  deMemset(&local_20,0xcd,4);
  this = stack0xfffffffffffffff0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,
             "GL_INVALID_ENUM is generated if shaderType or precisionType is not an accepted value."
             ,&local_1d9);
  NegativeTestContext::beginSection(this,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  glu::CallLogWrapper::glGetShaderPrecisionFormat
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0xffffffff,0x8df1,&local_1c,&local_20);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x500);
  glu::CallLogWrapper::glGetShaderPrecisionFormat
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8b31,0xffffffff,&local_1c,&local_20);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x500);
  glu::CallLogWrapper::glGetShaderPrecisionFormat
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0xffffffff,0xffffffff,&local_1c,
             &local_20);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x500);
  NegativeTestContext::endSection(stack0xfffffffffffffff0);
  return;
}

Assistant:

void get_shader_precision_format (NegativeTestContext& ctx)
{
	GLboolean	shaderCompilerSupported;
	GLint		range[2];
	GLint		precision[1];

	ctx.glGetBooleanv(GL_SHADER_COMPILER, &shaderCompilerSupported);
	ctx.getLog() << TestLog::Message << "// GL_SHADER_COMPILER = " << (shaderCompilerSupported ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;

	deMemset(&range[0], 0xcd, sizeof(range));
	deMemset(&precision[0], 0xcd, sizeof(precision));

	ctx.beginSection("GL_INVALID_ENUM is generated if shaderType or precisionType is not an accepted value.");
	ctx.glGetShaderPrecisionFormat (-1, GL_MEDIUM_FLOAT, &range[0], &precision[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetShaderPrecisionFormat (GL_VERTEX_SHADER, -1, &range[0], &precision[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetShaderPrecisionFormat (-1, -1, &range[0], &precision[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}